

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<test_result_(long_double)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(long_double)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001b9998;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<long_double>.impl_.value_ =
       (MatcherInterface<long_double> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<long_double>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<long_double>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<long_double>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b99e8;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}